

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-common.hpp
# Opt level: O0

bool __thiscall
baryonyx::itm::
solver_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_baryonyx::none_observer>
::is_timelimit_reached
          (solver_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_baryonyx::none_observer>
           *this)

{
  bool bVar1;
  rep rVar2;
  solver_functor<baryonyx::itm::solver_inequalities_Zcoeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_baryonyx::none_observer>
  *this_local;
  
  rVar2 = std::chrono::_V2::steady_clock::now();
  (this->m_end).__d.__r = rVar2;
  bVar1 = is_time_limit((this->m_ctx->parameters).time_limit,(time_point)(this->m_begin).__d.__r,
                        (time_point)(this->m_end).__d.__r);
  return bVar1;
}

Assistant:

bool is_timelimit_reached()
    {
        m_end = std::chrono::steady_clock::now();

        return is_time_limit(m_ctx.parameters.time_limit, m_begin, m_end);
    }